

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::timerEvent(QTreeView *this,QTimerEvent *event)

{
  bool bVar1;
  byte bVar2;
  TimerId TVar3;
  TimerId TVar4;
  int iVar5;
  State SVar6;
  QTreeViewPrivate *pQVar7;
  qsizetype qVar8;
  QTimerEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int x;
  int column;
  int i;
  int viewportWidth;
  int viewportHeight;
  QTreeViewPrivate *d;
  QModelIndex index;
  QPoint pos;
  QRect rect;
  qsizetype in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QRect *in_stack_ffffffffffffff38;
  QWidget *this_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar9;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  QWidget *this_01;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  QRect local_68;
  undefined8 local_58;
  QPoint local_50;
  undefined1 local_48 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar7 = d_func((QTreeView *)0x8f4065);
  TVar3 = QTimerEvent::id(in_RSI);
  TVar4 = QBasicTimer::id(&pQVar7->columnResizeTimer);
  if (TVar3 == TVar4) {
    (**(code **)(*(long *)in_RDI + 0x268))();
    QBasicTimer::stop();
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    QWidget::height((QWidget *)0x8f40f2);
    QWidget::width((QWidget *)0x8f4107);
    qVar8 = QList<int>::size(&pQVar7->columnsToUpdate);
    iVar9 = (int)qVar8;
    while (iVar9 = iVar9 + -1, -1 < iVar9) {
      QList<int>::at((QList<int> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28);
      columnViewportPosition
                ((QTreeView *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      bVar1 = QWidget::isRightToLeft((QWidget *)0x8f4167);
      iVar5 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      if (bVar1) {
        columnWidth((QTreeView *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),iVar5
                   );
        QRect::QRect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                     (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28)
        ;
        QRect::operator|=(in_stack_ffffffffffffff38,
                          (QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
      else {
        QRect::QRect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                     iVar5,(int)in_stack_ffffffffffffff28);
        QRect::operator|=(in_stack_ffffffffffffff38,
                          (QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      }
    }
    this_00 = (pQVar7->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
    local_48 = QRect::normalized();
    QWidget::update(this_00,(QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    QList<int>::clear((QList<int> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  else {
    iVar9 = QTimerEvent::timerId((QTimerEvent *)0x8f425d);
    iVar5 = QBasicTimer::timerId((QBasicTimer *)0x8f4272);
    if (iVar9 == iVar5) {
      local_50 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = QCursor::pos();
      local_50 = QWidget::mapFromGlobal
                           ((QWidget *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                            ,(QPoint *)in_stack_ffffffffffffff38);
      SVar6 = QAbstractItemView::state
                        ((QAbstractItemView *)CONCAT44(iVar9,in_stack_ffffffffffffff30));
      bVar2 = 0;
      if (SVar6 == DraggingState) {
        local_68 = QWidget::rect(in_RDI);
        bVar2 = QRect::contains((QPoint *)&local_68,SUB81(&local_50,0));
      }
      if ((bVar2 & 1) != 0) {
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        (**(code **)(*(long *)in_RDI + 0x1f0))(&local_80,in_RDI,&local_50);
        expand((QTreeView *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (QModelIndex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      QBasicTimer::stop();
    }
  }
  QAbstractItemView::timerEvent((QAbstractItemView *)this_01,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::timerEvent(QTimerEvent *event)
{
    Q_D(QTreeView);
    if (event->id() == d->columnResizeTimer.id()) {
        updateGeometries();
        d->columnResizeTimer.stop();
        QRect rect;
        int viewportHeight = d->viewport->height();
        int viewportWidth = d->viewport->width();
        for (int i = d->columnsToUpdate.size() - 1; i >= 0; --i) {
            int column = d->columnsToUpdate.at(i);
            int x = columnViewportPosition(column);
            if (isRightToLeft())
                rect |= QRect(0, 0, x + columnWidth(column), viewportHeight);
            else
                rect |= QRect(x, 0, viewportWidth - x, viewportHeight);
        }
        d->viewport->update(rect.normalized());
        d->columnsToUpdate.clear();
    } else if (event->timerId() == d->openTimer.timerId()) {
        QPoint pos = d->viewport->mapFromGlobal(QCursor::pos());
        if (state() == QAbstractItemView::DraggingState
            && d->viewport->rect().contains(pos)) {
            QModelIndex index = indexAt(pos);
            expand(index);
        }
        d->openTimer.stop();
    }

    QAbstractItemView::timerEvent(event);
}